

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O3

DOMNode * __thiscall
xercesc_4_0::DOMRangeImpl::traverseTextNode(DOMRangeImpl *this,DOMNode *n,bool isLeft,int how)

{
  short *psVar1;
  short *psVar2;
  DOMDocument *pDVar3;
  int iVar4;
  undefined4 extraout_var;
  char16_t *toDelete;
  undefined4 extraout_var_01;
  ulong uVar5;
  _func_int **pp_Var6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar7;
  _func_int *p_Var8;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  long lVar9;
  undefined4 extraout_var_14;
  MemoryManager *manager;
  _func_int **pp_Var10;
  ushort *puVar11;
  ushort uVar12;
  size_t __n;
  _func_int *p_Var13;
  XMLSize_t XVar14;
  _func_int **pp_Var15;
  DOMNode *pDVar16;
  ArrayJanitor<char16_t> janValue;
  XMLCh oldTemp [4000];
  ArrayJanitor<char16_t> local_1f88;
  _func_int *local_1f78 [1001];
  void *__src;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_07;
  
  iVar4 = (*n->_vptr_DOMNode[3])(n);
  __src = (void *)CONCAT44(extraout_var,iVar4);
  manager = this->fMemoryManager;
  if (__src == (void *)0x0) {
    toDelete = (char16_t *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)__src + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar4 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    toDelete = (char16_t *)CONCAT44(extraout_var_00,iVar4);
    memcpy(toDelete,__src,__n);
    manager = this->fMemoryManager;
  }
  ArrayJanitor<char16_t>::ArrayJanitor(&local_1f88,toDelete,manager);
  if (isLeft) {
    iVar4 = (*this->fStartContainer->_vptr_DOMNode[3])();
    XVar14 = 0;
    if (CONCAT44(extraout_var_01,iVar4) != 0) {
      do {
        psVar1 = (short *)(CONCAT44(extraout_var_01,iVar4) + XVar14);
        XVar14 = XVar14 + 2;
      } while (*psVar1 != 0);
      XVar14 = ((long)XVar14 >> 1) - 1;
    }
    iVar4 = (*(this->super_DOMRange)._vptr_DOMRange[3])(this);
    uVar5 = CONCAT44(extraout_var_02,iVar4);
    if (uVar5 == 0) {
      if (how != 2) {
        (*n->_vptr_DOMNode[0x13])(n,&XMLUni::fgZeroLenString);
        goto LAB_0027c974;
      }
    }
    else {
      if (uVar5 < 3999) {
        pp_Var6 = local_1f78;
      }
      else {
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar5 * 2 + 2);
        pp_Var6 = (_func_int **)CONCAT44(extraout_var_03,iVar4);
      }
      XMLString::subString
                ((XMLCh *)pp_Var6,toDelete,0,uVar5,
                 (MemoryManager *)this->fDocument[10].super_DOMNode._vptr_DOMNode);
      if (how != 2) {
        if (pp_Var6 == (_func_int **)0x0) {
          pp_Var15 = (_func_int **)0x0;
        }
        else {
          pDVar3 = this->fDocument;
          lVar9 = 0;
          do {
            psVar1 = (short *)((long)pp_Var6 + lVar9);
            lVar9 = lVar9 + 2;
          } while (*psVar1 != 0);
          uVar7 = (ulong)*(ushort *)pp_Var6;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            uVar12 = *(ushort *)((long)pp_Var6 + 2);
            if (uVar12 != 0) {
              puVar11 = (ushort *)((long)pp_Var6 + 4);
              do {
                uVar7 = (ulong)uVar12 + (uVar7 >> 0x18) + uVar7 * 0x26;
                uVar12 = *puVar11;
                puVar11 = puVar11 + 1;
              } while (uVar12 != 0);
            }
            uVar7 = uVar7 % (ulong)pDVar3[9].super_DOMNode._vptr_DOMNode;
          }
          p_Var13 = (_func_int *)((lVar9 >> 1) + -1);
          pp_Var10 = pDVar3[9].super_DOMDocumentTraversal._vptr_DOMDocumentTraversal;
          pp_Var15 = (_func_int **)pp_Var10[uVar7];
          if (pp_Var15 == (_func_int **)0x0) {
            pp_Var10 = pp_Var10 + uVar7;
          }
          else {
            do {
              pp_Var10 = pp_Var15;
              if (pp_Var10[1] == p_Var13) {
                pp_Var15 = pp_Var10 + 2;
                if (pp_Var15 == pp_Var6) goto LAB_0027c940;
                lVar9 = 0;
                do {
                  psVar1 = (short *)((long)pp_Var15 + lVar9);
                  if (*psVar1 == 0) {
                    if (*(short *)((long)pp_Var6 + lVar9) == 0) goto LAB_0027c940;
                    break;
                  }
                  psVar2 = (short *)((long)pp_Var6 + lVar9);
                  lVar9 = lVar9 + 2;
                } while (*psVar1 == *psVar2);
              }
              pp_Var15 = (_func_int **)*pp_Var10;
            } while ((_func_int **)*pp_Var10 != (_func_int **)0x0);
          }
          iVar4 = (*pDVar3[-1].super_DOMNode._vptr_DOMNode[4])
                            (&pDVar3[-1].super_DOMNode,(long)p_Var13 * 2 + 0x18);
          p_Var8 = (_func_int *)CONCAT44(extraout_var_07,iVar4);
          *pp_Var10 = p_Var8;
          *(_func_int **)(p_Var8 + 8) = p_Var13;
          *(undefined8 *)p_Var8 = 0;
          pp_Var15 = (_func_int **)(p_Var8 + 0x10);
          XMLString::copyString((XMLCh *)pp_Var15,(XMLCh *)pp_Var6);
        }
LAB_0027c940:
        (*n->_vptr_DOMNode[0x13])(n,pp_Var15);
      }
      if (0xf9e < uVar5) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pp_Var6);
      }
LAB_0027c974:
      if (how == 3) goto LAB_0027cbf4;
    }
    iVar4 = (*n->_vptr_DOMNode[0xd])(n,0);
    pDVar16 = (DOMNode *)CONCAT44(extraout_var_08,iVar4);
    if (XVar14 == uVar5) {
      (*pDVar16->_vptr_DOMNode[0x13])(pDVar16,&XMLUni::fgZeroLenString);
    }
    else {
      if (uVar5 < 3999) {
        pp_Var6 = local_1f78;
      }
      else {
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar5 * 2 + 2);
        pp_Var6 = (_func_int **)CONCAT44(extraout_var_09,iVar4);
      }
      XMLString::subString
                ((XMLCh *)pp_Var6,toDelete,uVar5,XVar14,
                 (MemoryManager *)this->fDocument[10].super_DOMNode._vptr_DOMNode);
      if (pp_Var6 == (_func_int **)0x0) {
        pp_Var15 = (_func_int **)0x0;
      }
      else {
        pDVar3 = this->fDocument;
        lVar9 = 0;
        do {
          psVar1 = (short *)((long)pp_Var6 + lVar9);
          lVar9 = lVar9 + 2;
        } while (*psVar1 != 0);
        uVar7 = (ulong)*(ushort *)pp_Var6;
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar12 = *(ushort *)((long)pp_Var6 + 2);
          if (uVar12 != 0) {
            puVar11 = (ushort *)((long)pp_Var6 + 4);
            do {
              uVar7 = (ulong)uVar12 + (uVar7 >> 0x18) + uVar7 * 0x26;
              uVar12 = *puVar11;
              puVar11 = puVar11 + 1;
            } while (uVar12 != 0);
          }
          uVar7 = uVar7 % (ulong)pDVar3[9].super_DOMNode._vptr_DOMNode;
        }
        p_Var13 = (_func_int *)((lVar9 >> 1) + -1);
        pp_Var10 = pDVar3[9].super_DOMDocumentTraversal._vptr_DOMDocumentTraversal;
        pp_Var15 = (_func_int **)pp_Var10[uVar7];
        if (pp_Var15 == (_func_int **)0x0) {
          pp_Var10 = pp_Var10 + uVar7;
        }
        else {
          do {
            pp_Var10 = pp_Var15;
            if (pp_Var10[1] == p_Var13) {
              pp_Var15 = pp_Var10 + 2;
              if (pp_Var15 == pp_Var6) goto LAB_0027caf8;
              lVar9 = 0;
              do {
                psVar1 = (short *)((long)pp_Var15 + lVar9);
                if (*psVar1 == 0) {
                  if (*(short *)((long)pp_Var6 + lVar9) == 0) goto LAB_0027caf8;
                  break;
                }
                psVar2 = (short *)((long)pp_Var6 + lVar9);
                lVar9 = lVar9 + 2;
              } while (*psVar1 == *psVar2);
            }
            pp_Var15 = (_func_int **)*pp_Var10;
          } while ((_func_int **)*pp_Var10 != (_func_int **)0x0);
        }
        iVar4 = (*pDVar3[-1].super_DOMNode._vptr_DOMNode[4])
                          (&pDVar3[-1].super_DOMNode,(long)p_Var13 * 2 + 0x18);
        p_Var8 = (_func_int *)CONCAT44(extraout_var_10,iVar4);
        *pp_Var10 = p_Var8;
        *(_func_int **)(p_Var8 + 8) = p_Var13;
        *(undefined8 *)p_Var8 = 0;
        pp_Var15 = (_func_int **)(p_Var8 + 0x10);
        XMLString::copyString((XMLCh *)pp_Var15,(XMLCh *)pp_Var6);
      }
LAB_0027caf8:
      (*pDVar16->_vptr_DOMNode[0x13])(pDVar16,pp_Var15);
      if (0xf9e < uVar5) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pp_Var6);
      }
    }
  }
  else {
    iVar4 = (*this->fEndContainer->_vptr_DOMNode[3])();
    XVar14 = 0;
    if (CONCAT44(extraout_var_04,iVar4) != 0) {
      do {
        psVar1 = (short *)(CONCAT44(extraout_var_04,iVar4) + XVar14);
        XVar14 = XVar14 + 2;
      } while (*psVar1 != 0);
      XVar14 = ((long)XVar14 >> 1) - 1;
    }
    iVar4 = (*(this->super_DOMRange)._vptr_DOMRange[5])(this);
    uVar5 = CONCAT44(extraout_var_05,iVar4);
    if (XVar14 == uVar5) {
      if (how != 2) {
        (*n->_vptr_DOMNode[0x13])(n,&XMLUni::fgZeroLenString);
        goto LAB_0027cbed;
      }
LAB_0027cbfc:
      iVar4 = (*n->_vptr_DOMNode[0xd])(n,0);
      pDVar16 = (DOMNode *)CONCAT44(extraout_var_12,iVar4);
      if (uVar5 == 0) {
        (*pDVar16->_vptr_DOMNode[0x13])(pDVar16,&XMLUni::fgZeroLenString);
      }
      else {
        if (uVar5 < 3999) {
          pp_Var6 = local_1f78;
        }
        else {
          iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                            (this->fMemoryManager,uVar5 * 2 + 2);
          pp_Var6 = (_func_int **)CONCAT44(extraout_var_13,iVar4);
        }
        XMLString::subString
                  ((XMLCh *)pp_Var6,toDelete,0,uVar5,
                   (MemoryManager *)this->fDocument[10].super_DOMNode._vptr_DOMNode);
        if (pp_Var6 == (_func_int **)0x0) {
          pp_Var15 = (_func_int **)0x0;
        }
        else {
          pDVar3 = this->fDocument;
          lVar9 = 0;
          do {
            psVar1 = (short *)((long)pp_Var6 + lVar9);
            lVar9 = lVar9 + 2;
          } while (*psVar1 != 0);
          uVar7 = (ulong)*(ushort *)pp_Var6;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            uVar12 = *(ushort *)((long)pp_Var6 + 2);
            if (uVar12 != 0) {
              puVar11 = (ushort *)((long)pp_Var6 + 4);
              do {
                uVar7 = (ulong)uVar12 + (uVar7 >> 0x18) + uVar7 * 0x26;
                uVar12 = *puVar11;
                puVar11 = puVar11 + 1;
              } while (uVar12 != 0);
            }
            uVar7 = uVar7 % (ulong)pDVar3[9].super_DOMNode._vptr_DOMNode;
          }
          p_Var13 = (_func_int *)((lVar9 >> 1) + -1);
          pp_Var10 = pDVar3[9].super_DOMDocumentTraversal._vptr_DOMDocumentTraversal;
          pp_Var15 = (_func_int **)pp_Var10[uVar7];
          if (pp_Var15 == (_func_int **)0x0) {
            pp_Var10 = pp_Var10 + uVar7;
          }
          else {
            do {
              pp_Var10 = pp_Var15;
              if (pp_Var10[1] == p_Var13) {
                pp_Var15 = pp_Var10 + 2;
                if (pp_Var15 == pp_Var6) goto LAB_0027cd71;
                lVar9 = 0;
                do {
                  psVar1 = (short *)((long)pp_Var15 + lVar9);
                  if (*psVar1 == 0) {
                    if (*(short *)((long)pp_Var6 + lVar9) == 0) goto LAB_0027cd71;
                    break;
                  }
                  psVar2 = (short *)((long)pp_Var6 + lVar9);
                  lVar9 = lVar9 + 2;
                } while (*psVar1 == *psVar2);
              }
              pp_Var15 = (_func_int **)*pp_Var10;
            } while ((_func_int **)*pp_Var10 != (_func_int **)0x0);
          }
          iVar4 = (*pDVar3[-1].super_DOMNode._vptr_DOMNode[4])
                            (&pDVar3[-1].super_DOMNode,(long)p_Var13 * 2 + 0x18);
          p_Var8 = (_func_int *)CONCAT44(extraout_var_14,iVar4);
          *pp_Var10 = p_Var8;
          *(_func_int **)(p_Var8 + 8) = p_Var13;
          *(undefined8 *)p_Var8 = 0;
          pp_Var15 = (_func_int **)(p_Var8 + 0x10);
          XMLString::copyString((XMLCh *)pp_Var15,(XMLCh *)pp_Var6);
        }
LAB_0027cd71:
        (*pDVar16->_vptr_DOMNode[0x13])(pDVar16,pp_Var15);
        if (0xf9e < uVar5) {
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pp_Var6);
        }
      }
      goto LAB_0027cd9a;
    }
    if (uVar5 < 3999) {
      pp_Var6 = local_1f78;
    }
    else {
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar5 * 2 + 2);
      pp_Var6 = (_func_int **)CONCAT44(extraout_var_06,iVar4);
    }
    XMLString::subString
              ((XMLCh *)pp_Var6,toDelete,uVar5,XVar14,
               (MemoryManager *)this->fDocument[10].super_DOMNode._vptr_DOMNode);
    if (how != 2) {
      if (pp_Var6 == (_func_int **)0x0) {
        pp_Var15 = (_func_int **)0x0;
      }
      else {
        pDVar3 = this->fDocument;
        lVar9 = 0;
        do {
          psVar1 = (short *)((long)pp_Var6 + lVar9);
          lVar9 = lVar9 + 2;
        } while (*psVar1 != 0);
        uVar7 = (ulong)*(ushort *)pp_Var6;
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar12 = *(ushort *)((long)pp_Var6 + 2);
          if (uVar12 != 0) {
            puVar11 = (ushort *)((long)pp_Var6 + 4);
            do {
              uVar7 = (ulong)uVar12 + (uVar7 >> 0x18) + uVar7 * 0x26;
              uVar12 = *puVar11;
              puVar11 = puVar11 + 1;
            } while (uVar12 != 0);
          }
          uVar7 = uVar7 % (ulong)pDVar3[9].super_DOMNode._vptr_DOMNode;
        }
        p_Var13 = (_func_int *)((lVar9 >> 1) + -1);
        pp_Var10 = pDVar3[9].super_DOMDocumentTraversal._vptr_DOMDocumentTraversal;
        pp_Var15 = (_func_int **)pp_Var10[uVar7];
        if (pp_Var15 == (_func_int **)0x0) {
          pp_Var10 = pp_Var10 + uVar7;
        }
        else {
          do {
            pp_Var10 = pp_Var15;
            if (pp_Var10[1] == p_Var13) {
              pp_Var15 = pp_Var10 + 2;
              if (pp_Var15 == pp_Var6) goto LAB_0027cbbb;
              lVar9 = 0;
              do {
                psVar1 = (short *)((long)pp_Var15 + lVar9);
                if (*psVar1 == 0) {
                  if (*(short *)((long)pp_Var6 + lVar9) == 0) goto LAB_0027cbbb;
                  break;
                }
                psVar2 = (short *)((long)pp_Var6 + lVar9);
                lVar9 = lVar9 + 2;
              } while (*psVar1 == *psVar2);
            }
            pp_Var15 = (_func_int **)*pp_Var10;
          } while ((_func_int **)*pp_Var10 != (_func_int **)0x0);
        }
        iVar4 = (*pDVar3[-1].super_DOMNode._vptr_DOMNode[4])
                          (&pDVar3[-1].super_DOMNode,(long)p_Var13 * 2 + 0x18);
        p_Var8 = (_func_int *)CONCAT44(extraout_var_11,iVar4);
        *pp_Var10 = p_Var8;
        *(_func_int **)(p_Var8 + 8) = p_Var13;
        *(undefined8 *)p_Var8 = 0;
        pp_Var15 = (_func_int **)(p_Var8 + 0x10);
        XMLString::copyString((XMLCh *)pp_Var15,(XMLCh *)pp_Var6);
      }
LAB_0027cbbb:
      (*n->_vptr_DOMNode[0x13])(n,pp_Var15);
    }
    if (0xf9e < uVar5) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pp_Var6);
    }
LAB_0027cbed:
    if (how != 3) goto LAB_0027cbfc;
LAB_0027cbf4:
    pDVar16 = (DOMNode *)0x0;
  }
LAB_0027cd9a:
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_1f88);
  return pDVar16;
}

Assistant:

DOMNode* DOMRangeImpl::traverseTextNode( DOMNode*n, bool isLeft, int how )
{
    XMLCh* txtValue = XMLString::replicate(n->getNodeValue(), fMemoryManager);
    ArrayJanitor<XMLCh> janValue(txtValue, fMemoryManager);

    if ( isLeft )
    {
        XMLSize_t startLen = XMLString::stringLen(fStartContainer->getNodeValue());
        XMLSize_t offset = getStartOffset();

        if (offset == 0) {
            if ( how != CLONE_CONTENTS )
                n->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* oldNodeValue;
            XMLCh oldTemp[4000];

            if (offset >= 3999)  {
                oldNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                oldNodeValue = oldTemp;
            }
            XMLString::subString(oldNodeValue, txtValue, 0, offset, ((DOMDocumentImpl *)fDocument)->getMemoryManager());

            if ( how != CLONE_CONTENTS )
                n->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(oldNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(oldNodeValue);//delete[] oldNodeValue;
        }

        if ( how==DELETE_CONTENTS )
            return 0;

        DOMNode* newNode = n->cloneNode( false );

        if (startLen == offset) {
            newNode->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* newNodeValue;
            XMLCh newTemp[4000];

            if (offset >= 3999)  {
                newNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                newNodeValue = newTemp;
            }
            XMLString::subString(newNodeValue, txtValue, offset, startLen, ((DOMDocumentImpl *)fDocument)->getMemoryManager());
            newNode->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(newNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(newNodeValue);//delete[] newNodeValue;

        }
        return newNode;
    }
    else
    {
        XMLSize_t endLen = XMLString::stringLen(fEndContainer->getNodeValue());
        XMLSize_t offset = getEndOffset();

        if (endLen == offset) {
            if ( how != CLONE_CONTENTS )
                n->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* oldNodeValue;
            XMLCh oldTemp[4000];

            if (offset >= 3999)  {
                oldNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                oldNodeValue = oldTemp;
            }
            XMLString::subString(oldNodeValue, txtValue, offset, endLen, ((DOMDocumentImpl *)fDocument)->getMemoryManager());

            if ( how != CLONE_CONTENTS )
                n->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(oldNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(oldNodeValue);//delete[] oldNodeValue;
        }

        if ( how==DELETE_CONTENTS )
            return 0;

        DOMNode* newNode = n->cloneNode( false );

        if (offset == 0) {
            newNode->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* newNodeValue;
            XMLCh newTemp[4000];

            if (offset >= 3999)  {
                newNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                newNodeValue = newTemp;
            }
            XMLString::subString(newNodeValue, txtValue, 0, offset, ((DOMDocumentImpl *)fDocument)->getMemoryManager());
            newNode->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(newNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(newNodeValue);//delete[] newNodeValue;

        }
        return newNode;
    }
}